

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderRectFilledRangeH
               (ImDrawList *draw_list,ImRect *rect,ImU32 col,float x_start_norm,float x_end_norm,
               float rounding)

{
  ImRect *pIVar1;
  float fVar2;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  float local_88;
  float local_84;
  float x1;
  float arc1_e;
  float arc1_b;
  ImVec2 local_74;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  float local_4c;
  undefined4 local_48;
  float x0;
  float half_pi;
  float arc0_e;
  float arc0_b;
  float inv_rounding;
  ImVec2 p1;
  ImVec2 p0;
  float rounding_local;
  float x_end_norm_local;
  float x_start_norm_local;
  ImU32 col_local;
  ImRect *rect_local;
  ImDrawList *draw_list_local;
  
  if ((x_end_norm != x_start_norm) || (NAN(x_end_norm) || NAN(x_start_norm))) {
    p0.x = rounding;
    p0.y = x_end_norm;
    rounding_local = x_start_norm;
    x_end_norm_local = (float)col;
    _x_start_norm_local = rect;
    rect_local = (ImRect *)draw_list;
    if (x_end_norm < x_start_norm) {
      ImSwap<float>(&rounding_local,&p0.y);
    }
    fVar2 = ImLerp<float>((_x_start_norm_local->Min).x,(_x_start_norm_local->Max).x,rounding_local);
    ImVec2::ImVec2(&p1,fVar2,(_x_start_norm_local->Min).y);
    fVar2 = ImLerp<float>((_x_start_norm_local->Min).x,(_x_start_norm_local->Max).x,p0.y);
    ImVec2::ImVec2((ImVec2 *)&arc0_b,fVar2,(_x_start_norm_local->Max).y);
    if ((p0.x != 0.0) || (NAN(p0.x))) {
      fVar2 = ImMin<float>(((_x_start_norm_local->Max).x - (_x_start_norm_local->Min).x) * 0.5,
                           ((_x_start_norm_local->Max).y - (_x_start_norm_local->Min).y) * 0.5);
      p0.x = ImClamp<float>(fVar2 - 1.0,0.0,p0.x);
      arc0_e = 1.0 / p0.x;
      half_pi = ImAcos01(-(p1.x - (_x_start_norm_local->Min).x) * arc0_e + 1.0);
      x0 = ImAcos01(-(arc0_b - (_x_start_norm_local->Min).x) * arc0_e + 1.0);
      local_48 = 0x3fc90fdb;
      local_4c = ImMax<float>(p1.x,(_x_start_norm_local->Min).x + p0.x);
      pIVar1 = rect_local;
      if ((half_pi != x0) || (NAN(half_pi) || NAN(x0))) {
        if ((((half_pi != 0.0) || (NAN(half_pi))) || (x0 != 1.5707964)) || (NAN(x0))) {
          ImVec2::ImVec2(&local_74,local_4c,inv_rounding - p0.x);
          ImDrawList::PathArcTo
                    ((ImDrawList *)pIVar1,&local_74,p0.x,3.1415927 - x0,3.1415927 - half_pi,3);
          pIVar1 = rect_local;
          ImVec2::ImVec2((ImVec2 *)&arc1_e,local_4c,p1.y + p0.x);
          ImDrawList::PathArcTo
                    ((ImDrawList *)pIVar1,(ImVec2 *)&arc1_e,p0.x,half_pi + 3.1415927,x0 + 3.1415927,
                     3);
        }
        else {
          ImVec2::ImVec2(&local_64,local_4c,inv_rounding - p0.x);
          ImDrawList::PathArcToFast((ImDrawList *)pIVar1,&local_64,p0.x,3,6);
          pIVar1 = rect_local;
          ImVec2::ImVec2(&local_6c,local_4c,p1.y + p0.x);
          ImDrawList::PathArcToFast((ImDrawList *)pIVar1,&local_6c,p0.x,6,9);
        }
      }
      else {
        ImVec2::ImVec2(&local_54,local_4c,inv_rounding);
        ImDrawList::PathLineTo((ImDrawList *)pIVar1,&local_54);
        pIVar1 = rect_local;
        ImVec2::ImVec2(&local_5c,local_4c,p1.y);
        ImDrawList::PathLineTo((ImDrawList *)pIVar1,&local_5c);
      }
      if ((_x_start_norm_local->Min).x + p0.x < arc0_b) {
        x1 = ImAcos01(-((_x_start_norm_local->Max).x - arc0_b) * arc0_e + 1.0);
        local_84 = ImAcos01(-((_x_start_norm_local->Max).x - p1.x) * arc0_e + 1.0);
        local_88 = ImMin<float>(arc0_b,(_x_start_norm_local->Max).x - p0.x);
        pIVar1 = rect_local;
        if ((x1 != local_84) || (NAN(x1) || NAN(local_84))) {
          if (((x1 != 0.0) || ((NAN(x1) || (local_84 != 1.5707964)))) || (NAN(local_84))) {
            ImVec2::ImVec2(&local_b0,local_88,p1.y + p0.x);
            ImDrawList::PathArcTo((ImDrawList *)pIVar1,&local_b0,p0.x,-local_84,-x1,3);
            pIVar1 = rect_local;
            ImVec2::ImVec2(&local_b8,local_88,inv_rounding - p0.x);
            ImDrawList::PathArcTo((ImDrawList *)pIVar1,&local_b8,p0.x,x1,local_84,3);
          }
          else {
            ImVec2::ImVec2(&local_a0,local_88,p1.y + p0.x);
            ImDrawList::PathArcToFast((ImDrawList *)pIVar1,&local_a0,p0.x,9,0xc);
            pIVar1 = rect_local;
            ImVec2::ImVec2(&local_a8,local_88,inv_rounding - p0.x);
            ImDrawList::PathArcToFast((ImDrawList *)pIVar1,&local_a8,p0.x,0,3);
          }
        }
        else {
          ImVec2::ImVec2(&local_90,local_88,p1.y);
          ImDrawList::PathLineTo((ImDrawList *)pIVar1,&local_90);
          pIVar1 = rect_local;
          ImVec2::ImVec2(&local_98,local_88,inv_rounding);
          ImDrawList::PathLineTo((ImDrawList *)pIVar1,&local_98);
        }
      }
      ImDrawList::PathFillConvex((ImDrawList *)rect_local,(ImU32)x_end_norm_local);
    }
    else {
      ImDrawList::AddRectFilled
                ((ImDrawList *)rect_local,&p1,(ImVec2 *)&arc0_b,(ImU32)x_end_norm_local,0.0,0);
    }
  }
  return;
}

Assistant:

void ImGui::RenderRectFilledRangeH(ImDrawList* draw_list, const ImRect& rect, ImU32 col, float x_start_norm, float x_end_norm, float rounding)
{
    if (x_end_norm == x_start_norm)
        return;
    if (x_start_norm > x_end_norm)
        ImSwap(x_start_norm, x_end_norm);

    ImVec2 p0 = ImVec2(ImLerp(rect.Min.x, rect.Max.x, x_start_norm), rect.Min.y);
    ImVec2 p1 = ImVec2(ImLerp(rect.Min.x, rect.Max.x, x_end_norm), rect.Max.y);
    if (rounding == 0.0f)
    {
        draw_list->AddRectFilled(p0, p1, col, 0.0f);
        return;
    }

    rounding = ImClamp(ImMin((rect.Max.x - rect.Min.x) * 0.5f, (rect.Max.y - rect.Min.y) * 0.5f) - 1.0f, 0.0f, rounding);
    const float inv_rounding = 1.0f / rounding;
    const float arc0_b = ImAcos01(1.0f - (p0.x - rect.Min.x) * inv_rounding);
    const float arc0_e = ImAcos01(1.0f - (p1.x - rect.Min.x) * inv_rounding);
    const float half_pi = IM_PI * 0.5f; // We will == compare to this because we know this is the exact value ImAcos01 can return.
    const float x0 = ImMax(p0.x, rect.Min.x + rounding);
    if (arc0_b == arc0_e)
    {
        draw_list->PathLineTo(ImVec2(x0, p1.y));
        draw_list->PathLineTo(ImVec2(x0, p0.y));
    }
    else if (arc0_b == 0.0f && arc0_e == half_pi)
    {
        draw_list->PathArcToFast(ImVec2(x0, p1.y - rounding), rounding, 3, 6); // BL
        draw_list->PathArcToFast(ImVec2(x0, p0.y + rounding), rounding, 6, 9); // TR
    }
    else
    {
        draw_list->PathArcTo(ImVec2(x0, p1.y - rounding), rounding, IM_PI - arc0_e, IM_PI - arc0_b, 3); // BL
        draw_list->PathArcTo(ImVec2(x0, p0.y + rounding), rounding, IM_PI + arc0_b, IM_PI + arc0_e, 3); // TR
    }
    if (p1.x > rect.Min.x + rounding)
    {
        const float arc1_b = ImAcos01(1.0f - (rect.Max.x - p1.x) * inv_rounding);
        const float arc1_e = ImAcos01(1.0f - (rect.Max.x - p0.x) * inv_rounding);
        const float x1 = ImMin(p1.x, rect.Max.x - rounding);
        if (arc1_b == arc1_e)
        {
            draw_list->PathLineTo(ImVec2(x1, p0.y));
            draw_list->PathLineTo(ImVec2(x1, p1.y));
        }
        else if (arc1_b == 0.0f && arc1_e == half_pi)
        {
            draw_list->PathArcToFast(ImVec2(x1, p0.y + rounding), rounding, 9, 12); // TR
            draw_list->PathArcToFast(ImVec2(x1, p1.y - rounding), rounding, 0, 3);  // BR
        }
        else
        {
            draw_list->PathArcTo(ImVec2(x1, p0.y + rounding), rounding, -arc1_e, -arc1_b, 3); // TR
            draw_list->PathArcTo(ImVec2(x1, p1.y - rounding), rounding, +arc1_b, +arc1_e, 3); // BR
        }
    }
    draw_list->PathFillConvex(col);
}